

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::Done
          (MeshEdgebreakerTraversalPredictiveEncoder *this)

{
  EncoderBuffer *target_buffer;
  EdgebreakerTopologyBitPattern EVar1;
  iterator __position;
  ulong uVar2;
  BinaryEncoder prediction_encoder;
  RAnsBitEncoder local_58;
  
  EVar1 = this->prev_symbol_;
  if (EVar1 != ~TOPOLOGY_C) {
    __position._M_current =
         (this->super_MeshEdgebreakerTraversalEncoder).symbols_.
         super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58.bit_counts_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = EVar1;
    if (__position._M_current ==
        (this->super_MeshEdgebreakerTraversalEncoder).symbols_.
        super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
      ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                ((vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                  *)&(this->super_MeshEdgebreakerTraversalEncoder).symbols_,__position,
                 (EdgebreakerTopologyBitPattern *)&local_58);
    }
    else {
      *__position._M_current = EVar1;
      (this->super_MeshEdgebreakerTraversalEncoder).symbols_.
      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  MeshEdgebreakerTraversalEncoder::Done(&this->super_MeshEdgebreakerTraversalEncoder);
  target_buffer = &(this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_;
  if ((this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.bit_encoder_reserved_bytes_ <
      1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)target_buffer,
               (this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.buffer_.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish,&this->num_split_symbols_,&this->last_corner_);
  }
  RAnsBitEncoder::RAnsBitEncoder(&local_58);
  RAnsBitEncoder::StartEncoding(&local_58);
  uVar2 = (ulong)((*(int *)&(this->predictions_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  *(int *)&(this->predictions_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                 (this->predictions_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  while (0 < (int)uVar2) {
    uVar2 = uVar2 - 1;
    RAnsBitEncoder::EncodeBit
              (&local_58,
               ((this->predictions_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >>
                (uVar2 & 0x3f) & 1) != 0);
  }
  RAnsBitEncoder::EndEncoding(&local_58,target_buffer);
  RAnsBitEncoder::~RAnsBitEncoder(&local_58);
  return;
}

Assistant:

void Done() {
    // We still need to store the last encoded symbol.
    if (prev_symbol_ != -1) {
      MeshEdgebreakerTraversalEncoder::EncodeSymbol(
          static_cast<EdgebreakerTopologyBitPattern>(prev_symbol_));
    }
    // Store the init face configurations and the explicitly encoded symbols.
    MeshEdgebreakerTraversalEncoder::Done();
    // Encode the number of split symbols.
    GetOutputBuffer()->Encode(num_split_symbols_);
    // Store the predictions.
    BinaryEncoder prediction_encoder;
    prediction_encoder.StartEncoding();
    for (int i = static_cast<int>(predictions_.size()) - 1; i >= 0; --i) {
      prediction_encoder.EncodeBit(predictions_[i]);
    }
    prediction_encoder.EndEncoding(GetOutputBuffer());
  }